

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O2

MutSuffix __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::Find
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name)

{
  iterator iVar1;
  SuffixBase SVar2;
  SuffixTable local_70;
  undefined1 local_50 [64];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  internal::SuffixBase::Impl::Impl((Impl *)local_50,name,0,0,&local_70);
  iVar1 = std::
          _Rb_tree<mp::internal::SuffixBase::Impl,_mp::internal::SuffixBase::Impl,_std::_Identity<mp::internal::SuffixBase::Impl>,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
          ::find(&(this->set_)._M_t,(key_type *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  std::__cxx11::string::~string((string *)&local_70);
  SVar2.impl_ = (Impl *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->set_)._M_t._M_impl.super__Rb_tree_header) {
    SVar2.impl_ = (Impl *)(iVar1._M_node + 1);
  }
  return (MutSuffix)SVar2.impl_;
}

Assistant:

MutSuffix Find(fmt::StringRef name) {
    typename Set::iterator i = set_.find(SuffixImpl(name));
    return MutSuffix(i != set_.end() ? &*i : 0);
  }